

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O0

void INT_CMpoll_network(CManager_conflict cm)

{
  FILE *__stream;
  int iVar1;
  __pid_t _Var2;
  pthread_t pVar3;
  long in_RDI;
  CMTraceType in_stack_0000000c;
  CManager in_stack_00000010;
  timespec ts;
  CMControlList cl;
  CMControlList in_stack_ffffffffffffffd8;
  timespec local_20;
  long local_10;
  long local_8;
  
  local_10 = *(long *)(in_RDI + 0x20);
  local_8 = in_RDI;
  if (*(long *)(in_RDI + 0x120) == 0) {
    iVar1 = CMtrace_init(in_stack_00000010,in_stack_0000000c);
    if (iVar1 == 0) goto LAB_00118c8e;
  }
  else if (CMtrace_val[3] == 0) goto LAB_00118c8e;
  if (CMtrace_PID != 0) {
    __stream = *(FILE **)(local_8 + 0x120);
    _Var2 = getpid();
    in_stack_ffffffffffffffd8 = (CMControlList)(long)_Var2;
    pVar3 = pthread_self();
    fprintf(__stream,"P%lxT%lx - ",in_stack_ffffffffffffffd8,pVar3);
  }
  if (CMtrace_timing != 0) {
    clock_gettime(1,&local_20);
    fprintf(*(FILE **)(local_8 + 0x120),"%lld.%.9ld - ",local_20.tv_sec,local_20.tv_nsec);
  }
  fprintf(*(FILE **)(local_8 + 0x120),"CM Poll Network\n");
LAB_00118c8e:
  fflush(*(FILE **)(local_8 + 0x120));
  (**(code **)(local_10 + 0x20))(&CMstatic_trans_svcs,*(undefined8 *)(local_10 + 0x30));
  CMcontrol_list_poll(in_stack_ffffffffffffffd8);
  return;
}

Assistant:

extern void
INT_CMpoll_network(CManager cm)
{
    CMControlList cl = cm->control_list;
    CMtrace_out(cm, CMLowLevelVerbose, "CM Poll Network\n");
    cl->network_polling_function.func((void*)&CMstatic_trans_svcs,
				      cl->network_polling_function.client_data);
    CMcontrol_list_poll(cl);
}